

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoBinop<unsigned_long,unsigned_long>
          (Thread *this,BinopTrapFunc<unsigned_long,_unsigned_long> *f,Ptr *out_trap)

{
  RunResult RVar1;
  Value VVar2;
  Value VVar3;
  unsigned_long out;
  string msg;
  Ptr local_38;
  
  VVar2 = Pop(this);
  VVar3 = Pop(this);
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  RVar1 = (*f)(VVar3.field_0.i64_,VVar2.field_0.i64_,&out,&msg);
  if (RVar1 == Trap) {
    Trap::New(&local_38,this->store_,&msg,&this->frames_);
    out_trap->obj_ = local_38.obj_;
    out_trap->store_ = local_38.store_;
    out_trap->root_index_ = local_38.root_index_;
    local_38.obj_ = (Trap *)0x0;
    local_38.store_ = (Store *)0x0;
    local_38.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_38);
    RVar1 = Trap;
  }
  else {
    Push<unsigned_long>(this,out);
    RVar1 = Ok;
  }
  std::__cxx11::string::_M_dispose();
  return RVar1;
}

Assistant:

RunResult Thread::DoBinop(BinopTrapFunc<R, T> f, Trap::Ptr* out_trap) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  T out;
  std::string msg;
  TRAP_IF(f(lhs, rhs, &out, &msg) == RunResult::Trap, msg);
  Push<R>(out);
  return RunResult::Ok;
}